

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::BinaryOpExpr::do_evaluate(BinaryOpExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *prVar2;
  long in_RSI;
  anon_class_96_2_f55c4da0 *in_RDI;
  anon_class_16_2_06e2585c_for_do_eval do_eval;
  Value l;
  Value *in_stack_fffffffffffffed0;
  anon_class_96_2_f55c4da0 *this_00;
  Value *in_stack_fffffffffffffef8;
  Value *in_stack_ffffffffffffff00;
  
  this_00 = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"BinaryOpExpr.left is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x30));
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"BinaryOpExpr.right is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3144cf);
  Expression::evaluate((Expression *)do_eval.context,(shared_ptr<minja::Context> *)do_eval.this);
  bVar1 = Value::is_callable((Value *)0x314511);
  if (bVar1) {
    Value::Value(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
    function<minja::BinaryOpExpr::do_evaluate(std::shared_ptr<minja::Context>const&)const::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_1_,void>
              ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
                *)this_00,in_RDI);
    Value::callable((CallableType *)in_stack_fffffffffffffef8);
    std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
    ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
               *)0x314573);
    const::{lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)#1}::~ArgumentsValue
              ((anon_class_96_2_f55c4da0 *)0x31457d);
  }
  else {
    do_evaluate::anon_class_96_2_f55c4da0::anon_class_16_2_06e2585c_for_do_eval::operator()
              ((anon_class_16_2_06e2585c_for_do_eval *)do_eval.context,(Value *)do_eval.this);
  }
  Value::~Value(in_stack_fffffffffffffed0);
  return &this_00->l;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!left) throw std::runtime_error("BinaryOpExpr.left is null");
        if (!right) throw std::runtime_error("BinaryOpExpr.right is null");
        auto l = left->evaluate(context);

        auto do_eval = [&](const Value & l) -> Value {
          if (op == Op::Is || op == Op::IsNot) {
            auto t = dynamic_cast<VariableExpr*>(right.get());
            if (!t) throw std::runtime_error("Right side of 'is' operator must be a variable");

            auto eval = [&]() {
              const auto & name = t->get_name();
              if (name == "none") return l.is_null();
              if (name == "boolean") return l.is_boolean();
              if (name == "integer") return l.is_number_integer();
              if (name == "float") return l.is_number_float();
              if (name == "number") return l.is_number();
              if (name == "string") return l.is_string();
              if (name == "mapping") return l.is_object();
              if (name == "iterable") return l.is_iterable();
              if (name == "sequence") return l.is_array();
              if (name == "defined") return !l.is_null();
              throw std::runtime_error("Unknown type for 'is' operator: " + name);
            };
            auto value = eval();
            return Value(op == Op::Is ? value : !value);
          }

          if (op == Op::And) {
            if (!l.to_bool()) return Value(false);
            return right->evaluate(context).to_bool();
          } else if (op == Op::Or) {
            if (l.to_bool()) return l;
            return right->evaluate(context);
          }

          auto r = right->evaluate(context);
          switch (op) {
              case Op::StrConcat: return l.to_str() + r.to_str();
              case Op::Add:       return l + r;
              case Op::Sub:       return l - r;
              case Op::Mul:       return l * r;
              case Op::Div:       return l / r;
              case Op::MulMul:    return std::pow(l.get<double>(), r.get<double>());
              case Op::DivDiv:    return l.get<int64_t>() / r.get<int64_t>();
              case Op::Mod:       return l.get<int64_t>() % r.get<int64_t>();
              case Op::Eq:        return l == r;
              case Op::Ne:        return l != r;
              case Op::Lt:        return l < r;
              case Op::Gt:        return l > r;
              case Op::Le:        return l <= r;
              case Op::Ge:        return l >= r;
              case Op::In:        return (r.is_array() || r.is_object()) && r.contains(l);
              case Op::NotIn:     return !(r.is_array() && r.contains(l));
              default:            break;
          }
          throw std::runtime_error("Unknown binary operator");
        };

        if (l.is_callable()) {
          return Value::callable([l, do_eval](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
            auto ll = l.call(context, args);
            return do_eval(ll); //args[0].second);
          });
        } else {
          return do_eval(l);
        }
    }